

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O2

string * ParseGroupFromPath(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string extension;
  size_type sVar5;
  
  std::__cxx11::string::string
            ((string *)&extension,anon_var_dwarf_88e547 + 9,(allocator *)&local_90);
  lVar3 = std::__cxx11::string::find((char *)file,0x4781d2);
  if (lVar3 != -1) {
    std::__cxx11::string::assign((char *)&extension);
  }
  lVar3 = std::__cxx11::string::find((char *)file,0x4781dd);
  if (lVar3 == -1) {
    sVar6 = file->_M_string_length;
    sVar5 = 0xffffffffffffffff;
    do {
      sVar4 = sVar6 - 1;
      iVar2 = (int)sVar5;
      if (sVar6 == 0) {
        if (iVar2 == -1) {
          std::operator+(&local_70,"[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
          std::operator+(&local_90,&local_70,"]");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &extension);
          std::__cxx11::string::~string((string *)&local_90);
          this = &local_70;
          goto LAB_003fe764;
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)file);
        std::operator+(&local_70,"[",&local_50);
        std::operator+(&local_90,&local_70,"]");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &extension);
        goto LAB_003fe6fe;
      }
      cVar1 = (file->_M_dataplus)._M_p[sVar6 - 1];
      sVar6 = sVar4;
    } while (((cVar1 != '\\') && (cVar1 != '/')) || (sVar5 = sVar4, iVar2 == -1));
    std::__cxx11::string::substr((ulong)&local_50,(ulong)file);
    std::operator+(&local_70,"[",&local_50);
    std::operator+(&local_90,&local_70,"]");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extension);
LAB_003fe6fe:
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    this = &local_50;
LAB_003fe764:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[coverage][.]",(allocator *)&local_90);
  }
  std::__cxx11::string::~string((string *)&extension);
  return __return_storage_ptr__;
}

Assistant:

static string ParseGroupFromPath(string file) {
	string extension = "";
	if (file.find(".test_slow") != std::string::npos) {
		// "slow" in the name indicates a slow test (i.e. only run as part of allunit)
		extension = "[.]";
	}
	if (file.find(".test_coverage") != std::string::npos) {
		// "coverage" in the name indicates a coverage test (i.e. only run as part of coverage)
		return "[coverage][.]";
	}
	// move backwards to the last slash
	int group_begin = -1, group_end = -1;
	for (idx_t i = file.size(); i > 0; i--) {
		if (file[i - 1] == '/' || file[i - 1] == '\\') {
			if (group_end == -1) {
				group_end = i - 1;
			} else {
				group_begin = i;
				return "[" + file.substr(group_begin, group_end - group_begin) + "]" + extension;
			}
		}
	}
	if (group_end == -1) {
		return "[" + file + "]" + extension;
	}
	return "[" + file.substr(0, group_end) + "]" + extension;
}